

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::BuildsystemFileScope::BuildsystemFileScope(BuildsystemFileScope *this,cmMakefile *mf)

{
  char *pcVar1;
  cmState *this_00;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  cmake *pcVar4;
  cmFileLockPool *this_01;
  cmStateSnapshot local_a8;
  cmStateSnapshot local_90;
  allocator local_61;
  cmStateDirectory local_60;
  undefined1 local_38 [8];
  string currentStart;
  cmMakefile *mf_local;
  BuildsystemFileScope *this_local;
  
  this->Makefile = mf;
  currentStart.field_2._8_8_ = mf;
  cmStateSnapshot::cmStateSnapshot(&this->Snapshot,(cmState *)0x0);
  this->ReportError = true;
  cmStateSnapshot::GetDirectory(&local_60,&this->Makefile->StateSnapshot);
  pcVar1 = cmStateDirectory::GetCurrentSource(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar1,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator+=((string *)local_38,"/CMakeLists.txt");
  cmStateSnapshot::SetListFile(&this->Makefile->StateSnapshot,(string *)local_38);
  this_00 = cmStateSnapshot::GetState(&this->Makefile->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot(&local_90,this_00,&this->Makefile->StateSnapshot);
  pcVar3 = this->Makefile;
  (pcVar3->StateSnapshot).Position.Position = local_90.Position.Position;
  (pcVar3->StateSnapshot).State = local_90.State;
  (pcVar3->StateSnapshot).Position.Tree = local_90.Position.Tree;
  PushFunctionBlockerBarrier(this->Makefile);
  pcVar2 = GetGlobalGenerator((cmMakefile *)currentStart.field_2._8_8_);
  this->GG = pcVar2;
  pcVar3 = cmGlobalGenerator::GetCurrentMakefile(this->GG);
  this->CurrentMakefile = pcVar3;
  pcVar4 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::GetCurrentSnapshot(&local_a8,pcVar4);
  (this->Snapshot).Position.Position = local_a8.Position.Position;
  (this->Snapshot).State = local_a8.State;
  (this->Snapshot).Position.Tree = local_a8.Position.Tree;
  pcVar4 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::SetCurrentSnapshot(pcVar4,&this->Snapshot);
  cmGlobalGenerator::SetCurrentMakefile(this->GG,(cmMakefile *)currentStart.field_2._8_8_);
  this_01 = cmGlobalGenerator::GetFileLockPool(this->GG);
  cmFileLockPool::PushFileScope(this_01);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

BuildsystemFileScope(cmMakefile* mf)
    : Makefile(mf)
    , ReportError(true)
  {
    std::string currentStart =
      this->Makefile->StateSnapshot.GetDirectory().GetCurrentSource();
    currentStart += "/CMakeLists.txt";
    this->Makefile->StateSnapshot.SetListFile(currentStart);
    this->Makefile->StateSnapshot =
      this->Makefile->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
        this->Makefile->StateSnapshot);
    this->Makefile->PushFunctionBlockerBarrier();

    this->GG = mf->GetGlobalGenerator();
    this->CurrentMakefile = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    this->GG->SetCurrentMakefile(mf);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PushFileScope();
#endif
  }